

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O0

void aom_lpf_horizontal_6_quad_avx2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined8 *puVar67;
  ulong *puVar68;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  int in_ESI;
  ulong *in_RDI;
  undefined1 *in_R8;
  __m256i filter;
  __m256i res;
  __m256i add;
  __m256i pixetFilter;
  __m256i four;
  __m128i work_1;
  __m128i flat_q1;
  __m128i flat_q0;
  __m128i flat_p0;
  __m128i flat_p1;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i qs1;
  __m128i qs0;
  __m128i ps0;
  __m128i ps1;
  __m128i hev;
  __m128i one;
  __m128i t7f;
  __m128i t1;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t3;
  __m128i t4;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i fe;
  __m128i work;
  __m128i ff;
  __m128i zero;
  __m128i blimit_v;
  __m128i limit_v;
  __m128i thresh_v;
  __m128i flat;
  __m128i mask;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m256i q256_0;
  __m256i p256_0;
  __m256i q256_1;
  __m256i p256_1;
  __m256i q256_2;
  __m256i p256_2;
  ulong local_1cd0;
  ulong uStack_1cc8;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  ulong local_1c40;
  ulong uStack_1c38;
  undefined8 local_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_18b0;
  ulong uStack_1890;
  ulong uStack_1870;
  ulong uStack_1850;
  ulong uStack_1830;
  undefined8 uStack_1810;
  ulong local_f00;
  ulong uStack_ef8;
  ulong local_ee0;
  ulong uStack_ed8;
  ulong local_ec0;
  ulong uStack_eb8;
  ulong local_ea0;
  ulong uStack_e98;
  ulong local_e00;
  ulong uStack_df8;
  ulong local_de0;
  ulong uStack_dd8;
  ulong local_140;
  ulong uStack_138;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar1 = *in_R8;
  uVar2 = *in_RCX;
  uVar3 = *in_RDX;
  auVar4 = vpcmpeqb_avx(ZEXT816(0),ZEXT816(0));
  auVar5 = vpinsrb_avx(ZEXT116(0xfe),0xfe,1);
  auVar5 = vpinsrb_avx(auVar5,0xfe,2);
  auVar5 = vpinsrb_avx(auVar5,0xfe,3);
  auVar5 = vpinsrb_avx(auVar5,0xfe,4);
  auVar5 = vpinsrb_avx(auVar5,0xfe,5);
  auVar5 = vpinsrb_avx(auVar5,0xfe,6);
  auVar5 = vpinsrb_avx(auVar5,0xfe,7);
  auVar5 = vpinsrb_avx(auVar5,0xfe,8);
  auVar5 = vpinsrb_avx(auVar5,0xfe,9);
  auVar5 = vpinsrb_avx(auVar5,0xfe,10);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xb);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xe);
  auVar6 = vpinsrb_avx(auVar5,0xfe,0xf);
  auVar46._8_8_ = uStack_1830;
  auVar46._0_8_ = uStack_1830;
  auVar5._8_8_ = uStack_1850;
  auVar5._0_8_ = uStack_1850;
  auVar5 = vpsubusb_avx(auVar46,auVar5);
  auVar45._8_8_ = uStack_1850;
  auVar45._0_8_ = uStack_1850;
  auVar44._8_8_ = uStack_1830;
  auVar44._0_8_ = uStack_1830;
  auVar12 = vpsubusb_avx(auVar45,auVar44);
  auVar5 = vpor_avx(auVar5,auVar12);
  auVar43._8_8_ = uStack_1890;
  auVar43._0_8_ = uStack_1890;
  auVar12._8_8_ = uStack_1870;
  auVar12._0_8_ = uStack_1870;
  auVar12 = vpsubusb_avx(auVar43,auVar12);
  auVar42._8_8_ = uStack_1870;
  auVar42._0_8_ = uStack_1870;
  auVar41._8_8_ = uStack_1890;
  auVar41._0_8_ = uStack_1890;
  auVar13 = vpsubusb_avx(auVar42,auVar41);
  auVar12 = vpor_avx(auVar12,auVar13);
  auVar40._8_8_ = uStack_1850;
  auVar40._0_8_ = uStack_1850;
  auVar39._8_8_ = uStack_1870;
  auVar39._0_8_ = uStack_1870;
  auVar13 = vpsubusb_avx(auVar40,auVar39);
  auVar38._8_8_ = uStack_1870;
  auVar38._0_8_ = uStack_1870;
  auVar37._8_8_ = uStack_1850;
  auVar37._0_8_ = uStack_1850;
  auVar14 = vpsubusb_avx(auVar38,auVar37);
  auVar13 = vpor_avx(auVar13,auVar14);
  auVar36._8_8_ = uStack_1830;
  auVar36._0_8_ = uStack_1830;
  auVar35._8_8_ = uStack_1890;
  auVar35._0_8_ = uStack_1890;
  auVar14 = vpsubusb_avx(auVar36,auVar35);
  auVar34._8_8_ = uStack_1890;
  auVar34._0_8_ = uStack_1890;
  auVar33._8_8_ = uStack_1830;
  auVar33._0_8_ = uStack_1830;
  auVar15 = vpsubusb_avx(auVar34,auVar33);
  auVar14 = vpor_avx(auVar14,auVar15);
  auVar12 = vpmaxub_avx(auVar5,auVar12);
  auVar5 = vpaddusb_avx(auVar13,auVar13);
  auVar6 = vpand_avx(auVar14,auVar6);
  auVar6 = vpsrlw_avx(auVar6,ZEXT416(1));
  auVar5 = vpaddusb_avx(auVar5,auVar6);
  auVar11[1] = uVar3;
  auVar11[0] = uVar3;
  auVar11[2] = uVar3;
  auVar11[3] = uVar3;
  auVar11[4] = uVar3;
  auVar11[5] = uVar3;
  auVar11[6] = uVar3;
  auVar11[7] = uVar3;
  auVar11[9] = uVar3;
  auVar11[8] = uVar3;
  auVar11[10] = uVar3;
  auVar11[0xb] = uVar3;
  auVar11[0xc] = uVar3;
  auVar11[0xd] = uVar3;
  auVar11[0xe] = uVar3;
  auVar11[0xf] = uVar3;
  auVar5 = vpsubusb_avx(auVar5,auVar11);
  auVar5 = vpcmpeqb_avx(auVar5,ZEXT816(0));
  local_1cd0 = auVar4._0_8_;
  uStack_1cc8 = auVar4._8_8_;
  local_de0 = auVar5._0_8_;
  uStack_dd8 = auVar5._8_8_;
  auVar47._8_8_ = uStack_dd8 ^ uStack_1cc8;
  auVar47._0_8_ = local_de0 ^ local_1cd0;
  auVar5 = vpmaxub_avx(auVar12,auVar47);
  auVar10._8_8_ = uStack_1810;
  auVar10._0_8_ = uStack_1810;
  auVar9._8_8_ = uStack_1830;
  auVar9._0_8_ = uStack_1830;
  auVar6 = vpsubusb_avx(auVar10,auVar9);
  auVar8._8_8_ = uStack_1830;
  auVar8._0_8_ = uStack_1830;
  auVar7._8_8_ = uStack_1810;
  auVar7._0_8_ = uStack_1810;
  auVar4 = vpsubusb_avx(auVar8,auVar7);
  auVar6 = vpor_avx(auVar6,auVar4);
  auVar15._8_8_ = uStack_18b0;
  auVar15._0_8_ = uStack_18b0;
  auVar4._8_8_ = uStack_1890;
  auVar4._0_8_ = uStack_1890;
  auVar4 = vpsubusb_avx(auVar15,auVar4);
  auVar14._8_8_ = uStack_1890;
  auVar14._0_8_ = uStack_1890;
  auVar13._8_8_ = uStack_18b0;
  auVar13._0_8_ = uStack_18b0;
  auVar13 = vpsubusb_avx(auVar14,auVar13);
  auVar4 = vpor_avx(auVar4,auVar13);
  auVar6 = vpmaxub_avx(auVar6,auVar4);
  auVar5 = vpmaxub_avx(auVar6,auVar5);
  auVar6[1] = uVar2;
  auVar6[0] = uVar2;
  auVar6[2] = uVar2;
  auVar6[3] = uVar2;
  auVar6[4] = uVar2;
  auVar6[5] = uVar2;
  auVar6[6] = uVar2;
  auVar6[7] = uVar2;
  auVar6[9] = uVar2;
  auVar6[8] = uVar2;
  auVar6[10] = uVar2;
  auVar6[0xb] = uVar2;
  auVar6[0xc] = uVar2;
  auVar6[0xd] = uVar2;
  auVar6[0xe] = uVar2;
  auVar6[0xf] = uVar2;
  auVar5 = vpsubusb_avx(auVar5,auVar6);
  auVar5 = vpcmpeqb_avx(auVar5,ZEXT816(0));
  auVar6 = vpcmpeqb_avx(auVar5,ZEXT816(0));
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
    auVar6 = vpinsrb_avx(ZEXT116(4),4,1);
    auVar6 = vpinsrb_avx(auVar6,4,2);
    auVar6 = vpinsrb_avx(auVar6,4,3);
    auVar6 = vpinsrb_avx(auVar6,4,4);
    auVar6 = vpinsrb_avx(auVar6,4,5);
    auVar6 = vpinsrb_avx(auVar6,4,6);
    auVar6 = vpinsrb_avx(auVar6,4,7);
    auVar6 = vpinsrb_avx(auVar6,4,8);
    auVar6 = vpinsrb_avx(auVar6,4,9);
    auVar6 = vpinsrb_avx(auVar6,4,10);
    auVar6 = vpinsrb_avx(auVar6,4,0xb);
    auVar6 = vpinsrb_avx(auVar6,4,0xc);
    auVar6 = vpinsrb_avx(auVar6,4,0xd);
    auVar6 = vpinsrb_avx(auVar6,4,0xe);
    auVar13 = vpinsrb_avx(auVar6,4,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar6 = vpinsrb_avx(auVar6,3,2);
    auVar6 = vpinsrb_avx(auVar6,3,3);
    auVar6 = vpinsrb_avx(auVar6,3,4);
    auVar6 = vpinsrb_avx(auVar6,3,5);
    auVar6 = vpinsrb_avx(auVar6,3,6);
    auVar6 = vpinsrb_avx(auVar6,3,7);
    auVar6 = vpinsrb_avx(auVar6,3,8);
    auVar6 = vpinsrb_avx(auVar6,3,9);
    auVar6 = vpinsrb_avx(auVar6,3,10);
    auVar6 = vpinsrb_avx(auVar6,3,0xb);
    auVar6 = vpinsrb_avx(auVar6,3,0xc);
    auVar6 = vpinsrb_avx(auVar6,3,0xd);
    auVar6 = vpinsrb_avx(auVar6,3,0xe);
    auVar14 = vpinsrb_avx(auVar6,3,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar6 = vpinsrb_avx(auVar6,0x80,2);
    auVar6 = vpinsrb_avx(auVar6,0x80,3);
    auVar6 = vpinsrb_avx(auVar6,0x80,4);
    auVar6 = vpinsrb_avx(auVar6,0x80,5);
    auVar6 = vpinsrb_avx(auVar6,0x80,6);
    auVar6 = vpinsrb_avx(auVar6,0x80,7);
    auVar6 = vpinsrb_avx(auVar6,0x80,8);
    auVar6 = vpinsrb_avx(auVar6,0x80,9);
    auVar6 = vpinsrb_avx(auVar6,0x80,10);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xe);
    auVar15 = vpinsrb_avx(auVar6,0x80,0xf);
    local_140 = auVar15._0_8_;
    uStack_138 = auVar15._8_8_;
    auVar6 = vpinsrb_avx(ZEXT116(0xe0),0xe0,1);
    auVar6 = vpinsrb_avx(auVar6,0xe0,2);
    auVar6 = vpinsrb_avx(auVar6,0xe0,3);
    auVar6 = vpinsrb_avx(auVar6,0xe0,4);
    auVar6 = vpinsrb_avx(auVar6,0xe0,5);
    auVar6 = vpinsrb_avx(auVar6,0xe0,6);
    auVar6 = vpinsrb_avx(auVar6,0xe0,7);
    auVar6 = vpinsrb_avx(auVar6,0xe0,8);
    auVar6 = vpinsrb_avx(auVar6,0xe0,9);
    auVar6 = vpinsrb_avx(auVar6,0xe0,10);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xb);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xc);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xd);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xe);
    auVar7 = vpinsrb_avx(auVar6,0xe0,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0x1f),0x1f,1);
    auVar6 = vpinsrb_avx(auVar6,0x1f,2);
    auVar6 = vpinsrb_avx(auVar6,0x1f,3);
    auVar6 = vpinsrb_avx(auVar6,0x1f,4);
    auVar6 = vpinsrb_avx(auVar6,0x1f,5);
    auVar6 = vpinsrb_avx(auVar6,0x1f,6);
    auVar6 = vpinsrb_avx(auVar6,0x1f,7);
    auVar6 = vpinsrb_avx(auVar6,0x1f,8);
    auVar6 = vpinsrb_avx(auVar6,0x1f,9);
    auVar6 = vpinsrb_avx(auVar6,0x1f,10);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xe);
    auVar8 = vpinsrb_avx(auVar6,0x1f,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar6 = vpinsrb_avx(auVar6,1,2);
    auVar6 = vpinsrb_avx(auVar6,1,3);
    auVar6 = vpinsrb_avx(auVar6,1,4);
    auVar6 = vpinsrb_avx(auVar6,1,5);
    auVar6 = vpinsrb_avx(auVar6,1,6);
    auVar6 = vpinsrb_avx(auVar6,1,7);
    auVar6 = vpinsrb_avx(auVar6,1,8);
    auVar6 = vpinsrb_avx(auVar6,1,9);
    auVar6 = vpinsrb_avx(auVar6,1,10);
    auVar6 = vpinsrb_avx(auVar6,1,0xb);
    auVar6 = vpinsrb_avx(auVar6,1,0xc);
    auVar6 = vpinsrb_avx(auVar6,1,0xd);
    auVar6 = vpinsrb_avx(auVar6,1,0xe);
    auVar9 = vpinsrb_avx(auVar6,1,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
    auVar6 = vpinsrb_avx(auVar6,0x7f,2);
    auVar6 = vpinsrb_avx(auVar6,0x7f,3);
    auVar6 = vpinsrb_avx(auVar6,0x7f,4);
    auVar6 = vpinsrb_avx(auVar6,0x7f,5);
    auVar6 = vpinsrb_avx(auVar6,0x7f,6);
    auVar6 = vpinsrb_avx(auVar6,0x7f,7);
    auVar6 = vpinsrb_avx(auVar6,0x7f,8);
    auVar6 = vpinsrb_avx(auVar6,0x7f,9);
    auVar6 = vpinsrb_avx(auVar6,0x7f,10);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xe);
    auVar10 = vpinsrb_avx(auVar6,0x7f,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar6 = vpinsrb_avx(auVar6,1,2);
    auVar6 = vpinsrb_avx(auVar6,1,3);
    auVar6 = vpinsrb_avx(auVar6,1,4);
    auVar6 = vpinsrb_avx(auVar6,1,5);
    auVar6 = vpinsrb_avx(auVar6,1,6);
    auVar6 = vpinsrb_avx(auVar6,1,7);
    auVar6 = vpinsrb_avx(auVar6,1,8);
    auVar6 = vpinsrb_avx(auVar6,1,9);
    auVar6 = vpinsrb_avx(auVar6,1,10);
    auVar6 = vpinsrb_avx(auVar6,1,0xb);
    auVar6 = vpinsrb_avx(auVar6,1,0xc);
    auVar6 = vpinsrb_avx(auVar6,1,0xd);
    auVar6 = vpinsrb_avx(auVar6,1,0xe);
    auVar11 = vpinsrb_avx(auVar6,1,0xf);
    auVar32[1] = uVar1;
    auVar32[0] = uVar1;
    auVar32[2] = uVar1;
    auVar32[3] = uVar1;
    auVar32[4] = uVar1;
    auVar32[5] = uVar1;
    auVar32[6] = uVar1;
    auVar32[7] = uVar1;
    auVar32[9] = uVar1;
    auVar32[8] = uVar1;
    auVar32[10] = uVar1;
    auVar32[0xb] = uVar1;
    auVar32[0xc] = uVar1;
    auVar32[0xd] = uVar1;
    auVar32[0xe] = uVar1;
    auVar32[0xf] = uVar1;
    auVar6 = vpsubusb_avx(auVar12,auVar32);
    auVar6 = vpcmpeqb_avx(auVar6,ZEXT816(0));
    local_e00 = auVar6._0_8_;
    uStack_df8 = auVar6._8_8_;
    auVar54._8_8_ = uStack_1830 ^ uStack_138;
    auVar54._0_8_ = uStack_1830 ^ local_140;
    auVar53._8_8_ = uStack_1890 ^ uStack_138;
    auVar53._0_8_ = uStack_1890 ^ local_140;
    auVar6 = vpsubsb_avx(auVar54,auVar53);
    auVar48._8_8_ = uStack_df8 ^ uStack_1cc8;
    auVar48._0_8_ = local_e00 ^ local_1cd0;
    auVar6 = vpand_avx(auVar6,auVar48);
    auVar52._8_8_ = uStack_1870 ^ uStack_138;
    auVar52._0_8_ = uStack_1870 ^ local_140;
    auVar51._8_8_ = uStack_1850 ^ uStack_138;
    auVar51._0_8_ = uStack_1850 ^ local_140;
    auVar4 = vpsubsb_avx(auVar52,auVar51);
    auVar6 = vpaddsb_avx(auVar6,auVar4);
    auVar6 = vpaddsb_avx(auVar6,auVar4);
    auVar6 = vpaddsb_avx(auVar6,auVar4);
    auVar4 = vpand_avx(auVar6,auVar5);
    auVar6 = vpaddsb_avx(auVar4,auVar13);
    auVar4 = vpaddsb_avx(auVar4,auVar14);
    auVar13 = vpcmpgtb_avx(ZEXT816(0),auVar6);
    auVar14 = vpsrlw_avx(auVar6,ZEXT416(3));
    auVar6 = vpand_avx(auVar13,auVar7);
    auVar13 = vpand_avx(auVar14,auVar8);
    auVar13 = vpor_avx(auVar13,auVar6);
    auVar50._8_8_ = uStack_1870 ^ uStack_138;
    auVar50._0_8_ = uStack_1870 ^ local_140;
    auVar6 = vpsubsb_avx(auVar50,auVar13);
    local_ea0 = auVar6._0_8_;
    uStack_e98 = auVar6._8_8_;
    auVar6 = vpcmpgtb_avx(ZEXT816(0),auVar4);
    auVar4 = vpsrlw_avx(auVar4,ZEXT416(3));
    auVar6 = vpand_avx(auVar6,auVar7);
    auVar4 = vpand_avx(auVar4,auVar8);
    auVar6 = vpor_avx(auVar4,auVar6);
    auVar56._8_8_ = uStack_1850 ^ uStack_138;
    auVar56._0_8_ = uStack_1850 ^ local_140;
    auVar6 = vpaddsb_avx(auVar56,auVar6);
    local_ec0 = auVar6._0_8_;
    uStack_eb8 = auVar6._8_8_;
    auVar6 = vpaddsb_avx(auVar13,auVar9);
    auVar4 = vpcmpgtb_avx(ZEXT816(0),auVar6);
    auVar13 = vpsrlw_avx(auVar6,ZEXT416(1));
    auVar6 = vpand_avx(auVar4,auVar15);
    auVar4 = vpand_avx(auVar13,auVar10);
    auVar6 = vpor_avx(auVar4,auVar6);
    auVar61._8_8_ = uStack_df8 ^ uStack_1cc8;
    auVar61._0_8_ = local_e00 ^ local_1cd0;
    auVar4 = vpandn_avx(auVar61,auVar6);
    auVar55._8_8_ = uStack_1830 ^ uStack_138;
    auVar55._0_8_ = uStack_1830 ^ local_140;
    auVar6 = vpaddsb_avx(auVar55,auVar4);
    local_ee0 = auVar6._0_8_;
    uStack_ed8 = auVar6._8_8_;
    auVar49._8_8_ = uStack_1890 ^ uStack_138;
    auVar49._0_8_ = uStack_1890 ^ local_140;
    auVar6 = vpsubsb_avx(auVar49,auVar4);
    local_f00 = auVar6._0_8_;
    uStack_ef8 = auVar6._8_8_;
    auVar31._8_8_ = uStack_1810;
    auVar31._0_8_ = uStack_1810;
    auVar30._8_8_ = uStack_1850;
    auVar30._0_8_ = uStack_1850;
    auVar6 = vpsubusb_avx(auVar31,auVar30);
    auVar29._8_8_ = uStack_1850;
    auVar29._0_8_ = uStack_1850;
    auVar28._8_8_ = uStack_1810;
    auVar28._0_8_ = uStack_1810;
    auVar4 = vpsubusb_avx(auVar29,auVar28);
    auVar6 = vpor_avx(auVar6,auVar4);
    auVar27._8_8_ = uStack_18b0;
    auVar27._0_8_ = uStack_18b0;
    auVar26._8_8_ = uStack_1870;
    auVar26._0_8_ = uStack_1870;
    auVar4 = vpsubusb_avx(auVar27,auVar26);
    auVar25._8_8_ = uStack_1870;
    auVar25._0_8_ = uStack_1870;
    auVar24._8_8_ = uStack_18b0;
    auVar24._0_8_ = uStack_18b0;
    auVar13 = vpsubusb_avx(auVar25,auVar24);
    auVar4 = vpor_avx(auVar4,auVar13);
    auVar6 = vpmaxub_avx(auVar6,auVar4);
    auVar6 = vpmaxub_avx(auVar6,auVar12);
    auVar6 = vpsubusb_avx(auVar6,auVar11);
    auVar6 = vpcmpeqb_avx(auVar6,ZEXT816(0));
    auVar5 = vpand_avx(auVar6,auVar5);
    auVar6 = vpcmpeqb_avx(auVar5,ZEXT816(0));
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      puVar68 = (ulong *)((long)in_RDI - (long)(in_ESI << 1));
      *puVar68 = local_ee0 ^ local_140;
      puVar68[1] = uStack_ed8 ^ uStack_138;
      *(ulong *)((long)in_RDI - (long)in_ESI) = local_ec0 ^ local_140;
      ((ulong *)((long)in_RDI - (long)in_ESI))[1] = uStack_eb8 ^ uStack_138;
      *in_RDI = local_ea0 ^ local_140;
      in_RDI[1] = uStack_e98 ^ uStack_138;
      *(ulong *)((long)in_RDI + (long)in_ESI) = local_f00 ^ local_140;
      ((ulong *)((long)in_RDI + (long)in_ESI))[1] = uStack_ef8 ^ uStack_138;
    }
    else {
      auVar6 = vpinsrw_avx(ZEXT216(4),4,1);
      auVar6 = vpinsrw_avx(auVar6,4,2);
      auVar6 = vpinsrw_avx(auVar6,4,3);
      auVar6 = vpinsrw_avx(auVar6,4,4);
      auVar6 = vpinsrw_avx(auVar6,4,5);
      auVar6 = vpinsrw_avx(auVar6,4,6);
      auVar6 = vpinsrw_avx(auVar6,4,7);
      auVar4 = vpinsrw_avx(ZEXT216(4),4,1);
      auVar4 = vpinsrw_avx(auVar4,4,2);
      auVar4 = vpinsrw_avx(auVar4,4,3);
      auVar4 = vpinsrw_avx(auVar4,4,4);
      auVar4 = vpinsrw_avx(auVar4,4,5);
      auVar4 = vpinsrw_avx(auVar4,4,6);
      auVar4 = vpinsrw_avx(auVar4,4,7);
      uStack_70 = auVar4._0_8_;
      uStack_68 = auVar4._8_8_;
      auVar65._8_8_ = uStack_1810;
      auVar65._0_8_ = uStack_1810;
      auVar65._16_8_ = uStack_1810;
      auVar65._24_8_ = uStack_1810;
      auVar17[8] = '\x04';
      auVar17[9] = 0x80;
      auVar17[10] = '\x05';
      auVar17[0xb] = 0x80;
      auVar17[0xc] = '\x06';
      auVar17[0xd] = 0x80;
      auVar17[0xe] = '\a';
      auVar17[0xf] = 0x80;
      auVar17[0] = '\0';
      auVar17[1] = 0x80;
      auVar17[2] = '\x01';
      auVar17[3] = 0x80;
      auVar17[4] = '\x02';
      auVar17[5] = 0x80;
      auVar17[6] = '\x03';
      auVar17[7] = 0x80;
      auVar17[0x10] = '\b';
      auVar17[0x11] = 0x80;
      auVar17[0x12] = '\t';
      auVar17[0x13] = 0x80;
      auVar17[0x14] = '\n';
      auVar17[0x15] = 0x80;
      auVar17[0x16] = '\v';
      auVar17[0x17] = 0x80;
      auVar17[0x18] = '\f';
      auVar17[0x19] = 0x80;
      auVar17[0x1a] = '\r';
      auVar17[0x1b] = 0x80;
      auVar17[0x1c] = '\x0e';
      auVar17[0x1d] = 0x80;
      auVar17[0x1e] = '\x0f';
      auVar17[0x1f] = 0x80;
      auVar17 = vpshufb_avx2(auVar65,auVar17);
      auVar64._8_8_ = uStack_1830;
      auVar64._0_8_ = uStack_1830;
      auVar64._16_8_ = uStack_1830;
      auVar64._24_8_ = uStack_1830;
      auVar18[8] = '\x04';
      auVar18[9] = 0x80;
      auVar18[10] = '\x05';
      auVar18[0xb] = 0x80;
      auVar18[0xc] = '\x06';
      auVar18[0xd] = 0x80;
      auVar18[0xe] = '\a';
      auVar18[0xf] = 0x80;
      auVar18[0] = '\0';
      auVar18[1] = 0x80;
      auVar18[2] = '\x01';
      auVar18[3] = 0x80;
      auVar18[4] = '\x02';
      auVar18[5] = 0x80;
      auVar18[6] = '\x03';
      auVar18[7] = 0x80;
      auVar18[0x10] = '\b';
      auVar18[0x11] = 0x80;
      auVar18[0x12] = '\t';
      auVar18[0x13] = 0x80;
      auVar18[0x14] = '\n';
      auVar18[0x15] = 0x80;
      auVar18[0x16] = '\v';
      auVar18[0x17] = 0x80;
      auVar18[0x18] = '\f';
      auVar18[0x19] = 0x80;
      auVar18[0x1a] = '\r';
      auVar18[0x1b] = 0x80;
      auVar18[0x1c] = '\x0e';
      auVar18[0x1d] = 0x80;
      auVar18[0x1e] = '\x0f';
      auVar18[0x1f] = 0x80;
      auVar18 = vpshufb_avx2(auVar64,auVar18);
      auVar63._8_8_ = uStack_1850;
      auVar63._0_8_ = uStack_1850;
      auVar63._16_8_ = uStack_1850;
      auVar63._24_8_ = uStack_1850;
      auVar19[8] = '\x04';
      auVar19[9] = 0x80;
      auVar19[10] = '\x05';
      auVar19[0xb] = 0x80;
      auVar19[0xc] = '\x06';
      auVar19[0xd] = 0x80;
      auVar19[0xe] = '\a';
      auVar19[0xf] = 0x80;
      auVar19[0] = '\0';
      auVar19[1] = 0x80;
      auVar19[2] = '\x01';
      auVar19[3] = 0x80;
      auVar19[4] = '\x02';
      auVar19[5] = 0x80;
      auVar19[6] = '\x03';
      auVar19[7] = 0x80;
      auVar19[0x10] = '\b';
      auVar19[0x11] = 0x80;
      auVar19[0x12] = '\t';
      auVar19[0x13] = 0x80;
      auVar19[0x14] = '\n';
      auVar19[0x15] = 0x80;
      auVar19[0x16] = '\v';
      auVar19[0x17] = 0x80;
      auVar19[0x18] = '\f';
      auVar19[0x19] = 0x80;
      auVar19[0x1a] = '\r';
      auVar19[0x1b] = 0x80;
      auVar19[0x1c] = '\x0e';
      auVar19[0x1d] = 0x80;
      auVar19[0x1e] = '\x0f';
      auVar19[0x1f] = 0x80;
      auVar19 = vpshufb_avx2(auVar63,auVar19);
      auVar62._8_8_ = uStack_1870;
      auVar62._0_8_ = uStack_1870;
      auVar62._16_8_ = uStack_1870;
      auVar62._24_8_ = uStack_1870;
      auVar20[8] = '\x04';
      auVar20[9] = 0x80;
      auVar20[10] = '\x05';
      auVar20[0xb] = 0x80;
      auVar20[0xc] = '\x06';
      auVar20[0xd] = 0x80;
      auVar20[0xe] = '\a';
      auVar20[0xf] = 0x80;
      auVar20[0] = '\0';
      auVar20[1] = 0x80;
      auVar20[2] = '\x01';
      auVar20[3] = 0x80;
      auVar20[4] = '\x02';
      auVar20[5] = 0x80;
      auVar20[6] = '\x03';
      auVar20[7] = 0x80;
      auVar20[0x10] = '\b';
      auVar20[0x11] = 0x80;
      auVar20[0x12] = '\t';
      auVar20[0x13] = 0x80;
      auVar20[0x14] = '\n';
      auVar20[0x15] = 0x80;
      auVar20[0x16] = '\v';
      auVar20[0x17] = 0x80;
      auVar20[0x18] = '\f';
      auVar20[0x19] = 0x80;
      auVar20[0x1a] = '\r';
      auVar20[0x1b] = 0x80;
      auVar20[0x1c] = '\x0e';
      auVar20[0x1d] = 0x80;
      auVar20[0x1e] = '\x0f';
      auVar20[0x1f] = 0x80;
      auVar20 = vpshufb_avx2(auVar62,auVar20);
      auVar22._8_8_ = uStack_1890;
      auVar22._0_8_ = uStack_1890;
      auVar22._16_8_ = uStack_1890;
      auVar22._24_8_ = uStack_1890;
      auVar21[8] = '\x04';
      auVar21[9] = 0x80;
      auVar21[10] = '\x05';
      auVar21[0xb] = 0x80;
      auVar21[0xc] = '\x06';
      auVar21[0xd] = 0x80;
      auVar21[0xe] = '\a';
      auVar21[0xf] = 0x80;
      auVar21[0] = '\0';
      auVar21[1] = 0x80;
      auVar21[2] = '\x01';
      auVar21[3] = 0x80;
      auVar21[4] = '\x02';
      auVar21[5] = 0x80;
      auVar21[6] = '\x03';
      auVar21[7] = 0x80;
      auVar21[0x10] = '\b';
      auVar21[0x11] = 0x80;
      auVar21[0x12] = '\t';
      auVar21[0x13] = 0x80;
      auVar21[0x14] = '\n';
      auVar21[0x15] = 0x80;
      auVar21[0x16] = '\v';
      auVar21[0x17] = 0x80;
      auVar21[0x18] = '\f';
      auVar21[0x19] = 0x80;
      auVar21[0x1a] = '\r';
      auVar21[0x1b] = 0x80;
      auVar21[0x1c] = '\x0e';
      auVar21[0x1d] = 0x80;
      auVar21[0x1e] = '\x0f';
      auVar21[0x1f] = 0x80;
      auVar21 = vpshufb_avx2(auVar22,auVar21);
      auVar23._8_8_ = uStack_18b0;
      auVar23._0_8_ = uStack_18b0;
      auVar23._16_8_ = uStack_18b0;
      auVar23._24_8_ = uStack_18b0;
      auVar16[8] = '\x04';
      auVar16[9] = 0x80;
      auVar16[10] = '\x05';
      auVar16[0xb] = 0x80;
      auVar16[0xc] = '\x06';
      auVar16[0xd] = 0x80;
      auVar16[0xe] = '\a';
      auVar16[0xf] = 0x80;
      auVar16[0] = '\0';
      auVar16[1] = 0x80;
      auVar16[2] = '\x01';
      auVar16[3] = 0x80;
      auVar16[4] = '\x02';
      auVar16[5] = 0x80;
      auVar16[6] = '\x03';
      auVar16[7] = 0x80;
      auVar16[0x10] = '\b';
      auVar16[0x11] = 0x80;
      auVar16[0x12] = '\t';
      auVar16[0x13] = 0x80;
      auVar16[0x14] = '\n';
      auVar16[0x15] = 0x80;
      auVar16[0x16] = '\v';
      auVar16[0x17] = 0x80;
      auVar16[0x18] = '\f';
      auVar16[0x19] = 0x80;
      auVar16[0x1a] = '\r';
      auVar16[0x1b] = 0x80;
      auVar16[0x1c] = '\x0e';
      auVar16[0x1d] = 0x80;
      auVar16[0x1e] = '\x0f';
      auVar16[0x1f] = 0x80;
      auVar22 = vpshufb_avx2(auVar23,auVar16);
      auVar16 = vpaddw_avx2(auVar18,auVar19);
      auVar16 = vpaddw_avx2(auVar17,auVar16);
      auVar23 = vpsllw_avx2(auVar16,ZEXT416(1));
      auVar16 = vpaddw_avx2(auVar17,auVar20);
      auVar16 = vpaddw_avx2(auVar23,auVar16);
      auVar66._16_8_ = uStack_70;
      auVar66._0_16_ = auVar6;
      auVar66._24_8_ = uStack_68;
      auVar23 = vpaddw_avx2(auVar66,auVar16);
      auVar16 = vpsrlw_avx2(auVar23,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar12 = vpcmpeqd_avx(auVar5,auVar5);
      auVar60._8_8_ = uStack_ed8 ^ uStack_138;
      auVar60._0_8_ = local_ee0 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar60);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar13 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar21,auVar17);
      auVar20 = vpsubw_avx2(auVar20,auVar17);
      auVar16 = vpaddw_avx2(auVar16,auVar20);
      auVar23 = vpaddw_avx2(auVar23,auVar16);
      auVar16 = vpsrlw_avx2(auVar23,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar59._8_8_ = uStack_eb8 ^ uStack_138;
      auVar59._0_8_ = local_ec0 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar59);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar14 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar22,auVar17);
      auVar17 = vpsubw_avx2(auVar21,auVar18);
      auVar16 = vpaddw_avx2(auVar16,auVar17);
      auVar23 = vpaddw_avx2(auVar23,auVar16);
      auVar16 = vpsrlw_avx2(auVar23,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar58._8_8_ = uStack_e98 ^ uStack_138;
      auVar58._0_8_ = local_ea0 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar58);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar4 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar22,auVar18);
      auVar17 = vpsubw_avx2(auVar22,auVar19);
      auVar16 = vpaddw_avx2(auVar16,auVar17);
      auVar16 = vpaddw_avx2(auVar23,auVar16);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar57._8_8_ = uStack_ef8 ^ uStack_138;
      auVar57._0_8_ = local_f00 ^ local_140;
      auVar6 = vpand_avx(auVar5 ^ auVar12,auVar57);
      auVar5 = vpand_avx(auVar5,auVar16._0_16_);
      auVar5 = vpor_avx(auVar5,auVar6);
      puVar67 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 3));
      *puVar67 = uStack_1810;
      puVar67[1] = uStack_1810;
      puVar67 = (undefined8 *)((long)in_RDI - (long)(in_ESI << 1));
      local_1c20 = auVar13._0_8_;
      uStack_1c18 = auVar13._8_8_;
      *puVar67 = local_1c20;
      puVar67[1] = uStack_1c18;
      local_1c30 = auVar14._0_8_;
      uStack_1c28 = auVar14._8_8_;
      *(undefined8 *)((long)in_RDI - (long)in_ESI) = local_1c30;
      ((undefined8 *)((long)in_RDI - (long)in_ESI))[1] = uStack_1c28;
      local_1c40 = auVar4._0_8_;
      uStack_1c38 = auVar4._8_8_;
      *in_RDI = local_1c40;
      in_RDI[1] = uStack_1c38;
      local_1c50 = auVar5._0_8_;
      uStack_1c48 = auVar5._8_8_;
      *(undefined8 *)((long)in_RDI + (long)in_ESI) = local_1c50;
      ((undefined8 *)((long)in_RDI + (long)in_ESI))[1] = uStack_1c48;
      puVar67 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1));
      *puVar67 = uStack_18b0;
      puVar67[1] = uStack_18b0;
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_6_quad_avx2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  __m256i p256_2, q256_2, p256_1, q256_1, p256_0, q256_0;
  __m128i p2, p1, p0, q0, q1, q2;
  __m128i mask, flat;

  const __m128i thresh_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_thresh0[0]));
  const __m128i limit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_limit0[0]));
  const __m128i blimit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_blimit0[0]));
  const __m128i zero = _mm_setzero_si128();
  const __m128i ff = _mm_cmpeq_epi8(zero, zero);

  p256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 3 * p)));
  p256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 2 * p)));
  p256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 1 * p)));
  q256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 0 * p)));
  q256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 1 * p)));
  q256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 2 * p)));

  p2 = _mm256_castsi256_si128(p256_2);
  p1 = _mm256_castsi256_si128(p256_1);
  p0 = _mm256_castsi256_si128(p256_0);
  q0 = _mm256_castsi256_si128(q256_0);
  q1 = _mm256_castsi256_si128(q256_1);
  q2 = _mm256_castsi256_si128(q256_2);

  {
    __m128i work;
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i abs_p1p0 =
        _mm_or_si128(_mm_subs_epu8(p1, p0), _mm_subs_epu8(p0, p1));
    const __m128i abs_q1q0 =
        _mm_or_si128(_mm_subs_epu8(q1, q0), _mm_subs_epu8(q0, q1));
    __m128i abs_p0q0 =
        _mm_or_si128(_mm_subs_epu8(p0, q0), _mm_subs_epu8(q0, p0));
    __m128i abs_p1q1 =
        _mm_or_si128(_mm_subs_epu8(p1, q1), _mm_subs_epu8(q1, p1));

    flat = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(flat, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p1), _mm_subs_epu8(p1, p2)),
        _mm_or_si128(_mm_subs_epu8(q2, q1), _mm_subs_epu8(q1, q2)));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // loop filter
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i one = _mm_set1_epi8(1);
    __m128i hev;

    hev = _mm_subs_epu8(flat, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);

    __m128i ps1 = _mm_xor_si128(p1, t80);
    __m128i ps0 = _mm_xor_si128(p0, t80);
    __m128i qs0 = _mm_xor_si128(q0, t80);
    __m128i qs1 = _mm_xor_si128(q1, t80);
    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;
    __m128i flat_p1, flat_p0, flat_q0, flat_q1;

    filt = _mm_and_si128(_mm_subs_epi8(ps1, qs1), hev);
    work_a = _mm_subs_epi8(qs0, ps0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);

    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    qs0 = _mm_xor_si128(_mm_subs_epi8(qs0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    ps0 = _mm_xor_si128(_mm_adds_epi8(ps0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    ps1 = _mm_xor_si128(_mm_adds_epi8(ps1, filt), t80);
    qs1 = _mm_xor_si128(_mm_subs_epi8(qs1, filt), t80);

    __m128i work;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p0), _mm_subs_epu8(p0, p2)),
        _mm_or_si128(_mm_subs_epu8(q2, q0), _mm_subs_epu8(q0, q2)));
    flat = _mm_max_epu8(work, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);

    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m256i four = _mm256_set1_epi16(4);
      __m256i pixetFilter, add, res;

      const __m256i filter =
          _mm256_load_si256((__m256i const *)filt_loopfilter_avx2);

      p256_2 = _mm256_shuffle_epi8(p256_2, filter);
      p256_1 = _mm256_shuffle_epi8(p256_1, filter);
      p256_0 = _mm256_shuffle_epi8(p256_0, filter);
      q256_0 = _mm256_shuffle_epi8(q256_0, filter);
      q256_1 = _mm256_shuffle_epi8(q256_1, filter);
      q256_2 = _mm256_shuffle_epi8(q256_2, filter);

      pixetFilter = _mm256_slli_epi16(
          _mm256_add_epi16(p256_2, _mm256_add_epi16(p256_1, p256_0)), 1);
      pixetFilter =
          _mm256_add_epi16(pixetFilter, _mm256_add_epi16(p256_2, q256_0));
      pixetFilter = _mm256_add_epi16(four, pixetFilter);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_p1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      p1 = _mm_andnot_si128(flat, ps1);
      flat_p1 = _mm_and_si128(flat, flat_p1);
      p1 = _mm_or_si128(flat_p1, p1);

      add = _mm256_add_epi16(_mm256_sub_epi16(q256_1, p256_2),
                             _mm256_sub_epi16(q256_0, p256_2));
      pixetFilter = _mm256_add_epi16(pixetFilter, add);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_p0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      p0 = _mm_andnot_si128(flat, ps0);
      flat_p0 = _mm_and_si128(flat, flat_p0);
      p0 = _mm_or_si128(flat_p0, p0);

      add = _mm256_add_epi16(_mm256_sub_epi16(q256_2, p256_2),
                             _mm256_sub_epi16(q256_1, p256_1));
      pixetFilter = _mm256_add_epi16(pixetFilter, add);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_q0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      q0 = _mm_andnot_si128(flat, qs0);
      flat_q0 = _mm_and_si128(flat, flat_q0);
      q0 = _mm_or_si128(flat_q0, q0);

      add = _mm256_add_epi16(_mm256_sub_epi16(q256_2, p256_1),
                             _mm256_sub_epi16(q256_2, p256_0));
      pixetFilter = _mm256_add_epi16(pixetFilter, add);
      res = _mm256_srli_epi16(pixetFilter, 3);
      flat_q1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res, res), 168));
      q1 = _mm_andnot_si128(flat, qs1);
      flat_q1 = _mm_and_si128(flat, flat_q1);
      q1 = _mm_or_si128(flat_q1, q1);

      _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
      _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), q0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
      _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), ps1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), ps0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), qs0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), qs1);
    }
  }
}